

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  bool bVar1;
  ostream *poVar2;
  domain_error *pdVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar4;
  undefined1 local_288 [8];
  ostringstream oss;
  SourceLineInfo local_110;
  string local_e8;
  string local_c8;
  Option<Catch::TagAlias> local_a8;
  string local_58;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  std::__cxx11::string::string((string *)local_288,alias,&local_34);
  std::__cxx11::string::string((string *)&local_a8,"[@",&local_33);
  bVar1 = startsWith((string *)local_288,(string *)&local_a8);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,alias,&local_32);
    std::__cxx11::string::string((string *)&local_c8,"]",&local_31);
    bVar1 = endsWith(&local_58,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)local_288);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_e8,tag,(allocator *)&local_58);
      SourceLineInfo::SourceLineInfo(&local_110,lineInfo);
      TagAlias::TagAlias((TagAlias *)&local_a8,&local_e8,&local_110);
      local_288 = (undefined1  [8])alias;
      TagAlias::TagAlias((TagAlias *)&oss,(TagAlias *)&local_a8);
      pVar4 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
              ::_M_emplace_unique<std::pair<char_const*,Catch::TagAlias>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                          *)&this->m_registry,(pair<const_char_*,_Catch::TagAlias> *)local_288);
      TagAlias::~TagAlias((TagAlias *)&oss);
      TagAlias::~TagAlias((TagAlias *)&local_a8);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_e8);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
      poVar2 = std::operator<<((ostream *)local_288,"error: tag alias, \"");
      poVar2 = std::operator<<(poVar2,alias);
      poVar2 = std::operator<<(poVar2,"\" already registered.\n");
      poVar2 = std::operator<<(poVar2,"\tFirst seen at ");
      std::__cxx11::string::string((string *)&local_58,alias,(allocator *)&local_c8);
      (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_a8,this,&local_58);
      operator<<(poVar2,&(local_a8.nullableValue)->lineInfo);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<(poVar2,"\tRedefined at ");
      operator<<(poVar2,lineInfo);
      Option<Catch::TagAlias>::reset(&local_a8);
      std::__cxx11::string::~string((string *)&local_58);
      pdVar3 = (domain_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::domain_error::domain_error(pdVar3,(char *)local_a8.nullableValue);
      __cxa_throw(pdVar3,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)local_288);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
  poVar2 = std::operator<<((ostream *)local_288,"error: tag alias, \"");
  poVar2 = std::operator<<(poVar2,alias);
  poVar2 = std::operator<<(poVar2,"\" is not of the form [@alias name].\n");
  operator<<(poVar2,lineInfo);
  pdVar3 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(pdVar3,(char *)local_a8.nullableValue);
  __cxa_throw(pdVar3,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }